

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5VtoVCreate(void *pCtx,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  long lVar1;
  undefined4 *puVar2;
  undefined8 *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  Fts5VtoVTokenizer *pNew;
  Fts5TokenizerModule *pMod;
  int rc;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (undefined4 *)
           sqlite3Fts5MallocZero
                     ((int *)0x0,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  *(undefined8 *)(puVar2 + 2) = *(undefined8 *)(in_RDI + 0x18);
  *(undefined8 *)(puVar2 + 4) = *(undefined8 *)(in_RDI + 0x20);
  *(undefined8 *)(puVar2 + 6) = *(undefined8 *)(in_RDI + 0x28);
  *(undefined8 *)(puVar2 + 8) = *(undefined8 *)(in_RDI + 0x30);
  *(undefined8 *)(puVar2 + 10) = *(undefined8 *)(in_RDI + 0x38);
  *(undefined8 *)(puVar2 + 0xc) = *(undefined8 *)(in_RDI + 0x40);
  *(undefined8 *)(puVar2 + 0xe) = *(undefined8 *)(in_RDI + 0x48);
  *puVar2 = *(undefined4 *)(in_RDI + 0x10);
  if (*(int *)(in_RDI + 0x10) == 0) {
    local_c = (**(code **)(in_RDI + 0x18))(*(undefined8 *)(in_RDI + 8),in_RSI,in_EDX,puVar2 + 0x10);
  }
  else {
    local_c = (**(code **)(in_RDI + 0x38))(*(undefined8 *)(in_RDI + 8),in_RSI,in_EDX,puVar2 + 0x10);
  }
  if (local_c != 0) {
    sqlite3_free((void *)0x28d0c0);
    puVar2 = (undefined4 *)0x0;
  }
  *in_RCX = puVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_c;
}

Assistant:

static int fts5VtoVCreate(
  void *pCtx,
  const char **azArg,
  int nArg,
  Fts5Tokenizer **ppOut
){
  Fts5TokenizerModule *pMod = (Fts5TokenizerModule*)pCtx;
  Fts5VtoVTokenizer *pNew = 0;
  int rc = SQLITE_OK;

  pNew = (Fts5VtoVTokenizer*)sqlite3Fts5MallocZero(&rc, sizeof(*pNew));
  if( rc==SQLITE_OK ){
    pNew->x1 = pMod->x1;
    pNew->x2 = pMod->x2;
    pNew->bV2Native = pMod->bV2Native;
    if( pMod->bV2Native ){
      rc = pMod->x2.xCreate(pMod->pUserData, azArg, nArg, &pNew->pReal);
    }else{
      rc = pMod->x1.xCreate(pMod->pUserData, azArg, nArg, &pNew->pReal);
    }
    if( rc!=SQLITE_OK ){
      sqlite3_free(pNew);
      pNew = 0;
    }
  }

  *ppOut = (Fts5Tokenizer*)pNew;
  return rc;
}